

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkCollectStats(Wlc_Ntk_t *p,int (*nObjs) [60])

{
  ushort uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  long lVar7;
  
  if ((p->vPos).nSize != 2) {
    return;
  }
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    Wlc_NtkMarkCone(p,(int)lVar7,1,1,0);
    iVar5 = p->iObj;
    if (1 < iVar5) {
      lVar3 = 1;
      lVar4 = 0x18;
      do {
        if (p->nObjsAlloc <= lVar3) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        uVar1 = *(ushort *)(&p->pObjs->field_0x0 + lVar4);
        if ((char)uVar1 < '\0') {
          nObjs[lVar7][uVar1 & 0x3f] = nObjs[lVar7][uVar1 & 0x3f] + 1;
          iVar5 = p->iObj;
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while (lVar3 < iVar5);
    }
    lVar7 = 1;
    bVar2 = false;
  } while (bVar6);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkCollectStats( Wlc_Ntk_t * p, int nObjs[2][WLC_OBJ_NUMBER] )
{
    Wlc_Obj_t * pObj;
    int n, i;
    if ( Wlc_NtkPoNum(p) != 2 )
        return;
    for ( n = 0; n < 2; n++ )
    {
        Wlc_NtkMarkCone( p, n, 1, 1, 0 );
        Wlc_NtkForEachObj( p, pObj, i )
            if ( pObj->Mark )
                nObjs[n][pObj->Type]++;
    }
    Wlc_NtkCleanMarks( p );
}